

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_backward_Test::TestBody
          (IntrusiveListIteratorTest_crbegin_crend_backward_Test *this)

{
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_88
  ;
  TestObject *local_78;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_70
  ;
  TestObjectList *local_60;
  undefined8 local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  local_50.current.list_ = &(this->super_IntrusiveListIteratorTest).list_;
  local_38 = 0;
  local_50.current.node_ = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_40 = local_50.current.list_;
  piVar1 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_88.current.node_ = (TestObject *)((long)&piVar1->last_ + 4);
  piVar1->first_ = (TestObject *)0x200000001;
  *(undefined4 *)&piVar1->last_ = 3;
  local_88.current.list_ = piVar1;
  local_78 = local_88.current.node_;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,&local_88,
             (vector<int,_std::allocator<int>_> *)0x200000001);
  operator_delete(piVar1);
  local_70.current.list_ = (this->super_IntrusiveListIteratorTest).clist_;
  local_58 = 0;
  local_70.current.node_ = (local_70.current.list_)->first_;
  local_60 = local_70.current.list_;
  piVar1 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_88.current.node_ = (TestObject *)((long)&piVar1->last_ + 4);
  piVar1->first_ = (TestObject *)0x200000001;
  *(undefined4 *)&piVar1->last_ = 3;
  local_88.current.list_ = piVar1;
  local_78 = local_88.current.node_;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_60,&local_70,&local_88,
             (vector<int,_std::allocator<int>_> *)0x200000001);
  operator_delete(piVar1);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_backward) {
  TestBackward(list_.crbegin(), list_.crend(), {1, 2, 3});
  TestBackward(clist_.crbegin(), clist_.crend(), {1, 2, 3});
}